

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DashTests.cpp
# Opt level: O0

void __thiscall agge::tests::DashTests::SegmentAreOutputtedAsIsIfDashIsLong(DashTests *this)

{
  point pVar1;
  allocator local_231;
  string local_230 [32];
  LocationInfo local_210;
  undefined1 auStack_1e8 [8];
  point reference2 [4];
  undefined1 local_178 [8];
  point result2 [4];
  string local_140 [32];
  LocationInfo local_120;
  undefined1 auStack_f8 [8];
  point reference1 [3];
  undefined1 local_98 [8];
  point result1 [3];
  undefined1 local_68 [8];
  dash d;
  DashTests *this_local;
  
  d._pattern._limit = (dash_gap *)this;
  dash::dash((dash *)local_68);
  dash::add_dash((dash *)local_68,6.0,1.0);
  move_to<agge::dash>((dash *)local_68,1.1,17.0);
  line_to<agge::dash>((dash *)local_68,4.1,13.0,false);
  pVar1 = vertex<agge::dash>((dash *)local_68);
  result1[0].x = (real_t)pVar1.command;
  local_98 = pVar1._0_8_;
  pVar1 = vertex<agge::dash>((dash *)local_68);
  result1[1].x = (real_t)pVar1.command;
  result1[0]._4_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::dash>((dash *)local_68);
  result1[2].x = (real_t)pVar1.command;
  result1[1]._4_8_ = pVar1._0_8_;
  reference1[1].y = 0.0;
  reference1[1].command = 0;
  reference1[2].x = 0.0;
  auStack_f8._0_4_ = 1.1;
  auStack_f8._4_4_ = 17.0;
  reference1[0].x = 1.4013e-45;
  reference1[0].y = 4.1;
  reference1[0].command = 0x41500000;
  reference1[1].x = 2.8026e-45;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_140,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/DashTests.cpp"
             ,(allocator *)((long)&result2[3].command + 3));
  ut::LocationInfo::LocationInfo(&local_120,(string *)local_140,0x21);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,3ul>
            ((point (*) [3])auStack_f8,(point (*) [3])local_98,&local_120);
  ut::LocationInfo::~LocationInfo(&local_120);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)((long)&result2[3].command + 3));
  dash::remove_all((dash *)local_68);
  move_to<agge::dash>((dash *)local_68,1.0,1.0);
  line_to<agge::dash>((dash *)local_68,2.5,3.0,false);
  line_to<agge::dash>((dash *)local_68,2.7,3.1,false);
  pVar1 = vertex<agge::dash>((dash *)local_68);
  result2[0].x = (real_t)pVar1.command;
  local_178 = pVar1._0_8_;
  pVar1 = vertex<agge::dash>((dash *)local_68);
  result2[1].x = (real_t)pVar1.command;
  result2[0]._4_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::dash>((dash *)local_68);
  result2[2].x = (real_t)pVar1.command;
  result2[1]._4_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::dash>((dash *)local_68);
  result2[3].x = (real_t)pVar1.command;
  reference2[3]._4_8_ = pVar1._0_8_;
  reference2[2].x = 2.8026e-45;
  reference2[2].y = 0.0;
  reference2[2].command = 0;
  reference2[3].x = 0.0;
  reference2[0].command = 0x40400000;
  reference2[1].x = 2.8026e-45;
  reference2[1].y = 2.7;
  reference2[1].command = 0x40466666;
  auStack_1e8._0_4_ = 1.0;
  auStack_1e8._4_4_ = 1.0;
  reference2[0].x = 1.4013e-45;
  reference2[0].y = 2.5;
  result2[2]._4_8_ = reference2[3]._4_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_230,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/DashTests.cpp"
             ,&local_231);
  ut::LocationInfo::LocationInfo(&local_210,(string *)local_230,0x32);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,4ul>
            ((point (*) [4])auStack_1e8,(point (*) [4])local_178,&local_210);
  ut::LocationInfo::~LocationInfo(&local_210);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  dash::~dash((dash *)local_68);
  return;
}

Assistant:

test( SegmentAreOutputtedAsIsIfDashIsLong )
			{
				// INIT
				dash d;

				// INIT / ACT
				d.add_dash(6.0f, 1.0f);

				// ACT
				move_to(d, 1.1f, 17.0f);
				line_to(d, 4.1f, 13.0f);
				mocks::path::point result1[] = { vertex(d), vertex(d), vertex(d), };

				// ASSERT
				mocks::path::point reference1[] = {
					{ 1.1f, 17.0f, path_command_move_to },
					{ 4.1f, 13.0f, path_command_line_to },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference1, result1);

				// ACT
				d.remove_all();
				move_to(d, 1.0f, 1.0f);
				line_to(d, 2.5f, 3.0f);
				line_to(d, 2.7f, 3.1f);
				mocks::path::point result2[] = { vertex(d), vertex(d), vertex(d), vertex(d), };

				// ASSERT
				mocks::path::point reference2[] = {
					{ 1.0f, 1.0f, path_command_move_to },
					{ 2.5f, 3.0f, path_command_line_to },
					{ 2.7f, 3.1f, path_command_line_to },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference2, result2);
			}